

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O0

Request<capnp::DynamicStruct,_capnp::DynamicStruct> * __thiscall
capnp::DynamicCapability::Client::newRequest
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *__return_storage_ptr__,Client *this,
          Method method,Maybe<capnp::MessageSize> *sizeHint)

{
  Builder builder;
  bool bVar1;
  uint uVar2;
  StructSchema schema;
  ClientHook *pCVar3;
  uint64_t uVar4;
  Own<capnp::RequestHook,_std::nullptr_t> *hook;
  BuilderFor<capnp::DynamicStruct> local_110;
  ushort local_da;
  Maybe<capnp::MessageSize> local_d8;
  Reader local_c0;
  undefined1 local_90 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  Schema SStack_60;
  CallHints hints;
  StructSchema resultType;
  StructSchema paramType;
  Fault local_40;
  Fault f;
  bool local_2a;
  DebugExpression<bool> local_29;
  Schema SStack_28;
  DebugExpression<bool> _kjCondition;
  InterfaceSchema methodInterface;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  f.exception = (Exception *)InterfaceSchema::Method::getContainingInterface(&method);
  SStack_28.raw = (RawBrandedSchema *)f.exception;
  local_2a = InterfaceSchema::extends(&this->schema,(InterfaceSchema)f.exception);
  local_29 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_29);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
               ,0x26,FAILED,"schema.extends(methodInterface)",
               "_kjCondition,\"Interface does not implement this method.\"",&local_29,
               (char (*) [42])"Interface does not implement this method.");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  schema = InterfaceSchema::Method::getParamType(&method);
  SStack_60.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType(&method);
  Capability::Client::CallHints::CallHints((CallHints *)((long)&typeless.hook.ptr + 6));
  bVar1 = StructSchema::mayContainCapabilities((StructSchema *)&stack0xffffffffffffffa0);
  typeless.hook.ptr._6_1_ = !bVar1;
  pCVar3 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)this);
  Schema::getProto(&local_c0,&stack0xffffffffffffffd8);
  uVar4 = capnp::schema::Node::Reader::getId(&local_c0);
  uVar2 = InterfaceSchema::Method::getIndex(&method);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_d8,sizeHint);
  local_da = typeless.hook.ptr._6_2_;
  (**pCVar3->_vptr_ClientHook)
            (local_90,pCVar3,uVar4,(ulong)(uVar2 & 0xffff),&local_d8,(ulong)typeless.hook.ptr._6_2_)
  ;
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_d8);
  AnyPointer::Builder::getAs<capnp::DynamicStruct>(&local_110,(Builder *)local_90,schema);
  hook = kj::mv<kj::Own<capnp::RequestHook,decltype(nullptr)>>
                   ((Own<capnp::RequestHook,_std::nullptr_t> *)
                    &typeless.super_Builder.builder.pointer);
  builder.builder.segment = local_110.builder.segment;
  builder.schema.super_Schema.raw = local_110.schema.super_Schema.raw;
  builder.builder.capTable = local_110.builder.capTable;
  builder.builder.data = local_110.builder.data;
  builder.builder.pointers = local_110.builder.pointers;
  builder.builder.dataSize = local_110.builder.dataSize;
  builder.builder.pointerCount = local_110.builder.pointerCount;
  builder.builder._38_2_ = local_110.builder._38_2_;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::Request
            (__return_storage_ptr__,builder,hook,(StructSchema)SStack_60.raw);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
            ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Request<DynamicStruct, DynamicStruct> DynamicCapability::Client::newRequest(
    InterfaceSchema::Method method, kj::Maybe<MessageSize> sizeHint) {
  auto methodInterface = method.getContainingInterface();

  KJ_REQUIRE(schema.extends(methodInterface), "Interface does not implement this method.");

  auto paramType = method.getParamType();
  auto resultType = method.getResultType();

  CallHints hints;
  hints.noPromisePipelining = !resultType.mayContainCapabilities();

  auto typeless = hook->newCall(
      methodInterface.getProto().getId(), method.getIndex(), sizeHint, hints);

  return Request<DynamicStruct, DynamicStruct>(
      typeless.getAs<DynamicStruct>(paramType), kj::mv(typeless.hook), resultType);
}